

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLongStressCase.hpp
# Opt level: O1

void __thiscall
deqp::gls::VarSpec::VarSpec<tcu::Vector<float,2>>
          (VarSpec *this,string *name_,Vector<float,_2> *minValue_,Vector<float,_2> *maxValue_)

{
  pointer pcVar1;
  int i;
  DataType DVar2;
  long lVar3;
  
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  pcVar1 = (name_->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + name_->_M_string_length);
  DVar2 = glu::getDataTypeFloatVec(2);
  this->type = DVar2;
  lVar3 = 0;
  do {
    *(float *)((long)&this->minValue + lVar3 * 4) = minValue_->m_data[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 == 1);
  lVar3 = 0;
  do {
    *(float *)((long)&this->maxValue + lVar3 * 4) = maxValue_->m_data[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 == 1);
  return;
}

Assistant:

VarSpec (const std::string& name_, const T& minValue_, const T& maxValue_)	: name(name_) { set(minValue_, maxValue_); }